

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O3

bool __thiscall capnp::MessageBuilder::isCanonical(MessageBuilder *this)

{
  word *location;
  bool bVar1;
  SegmentBuilder *segment;
  SegmentReader *pSVar2;
  word *readHead;
  word *local_40;
  PointerReader local_38;
  
  segment = getRootSegment(this);
  if ((segment != (SegmentBuilder *)0x0) &&
     (pSVar2 = _::BuilderArena::tryGetSegment((BuilderArena *)this->arenaSpace,(SegmentId)0x1),
     pSVar2 == (SegmentReader *)0x0)) {
    location = (segment->super_SegmentReader).ptr.ptr;
    local_40 = location + 1;
    _::PointerReader::getRoot
              (&local_38,&segment->super_SegmentReader,(CapTableReader *)0x0,location,0x7fffffff);
    bVar1 = _::PointerReader::isCanonical(&local_38,&local_40);
    return bVar1;
  }
  return false;
}

Assistant:

bool MessageBuilder::isCanonical() {
  _::SegmentReader *segment = getRootSegment();

  if (segment == NULL) {
    // The message has no segments
    return false;
  }

  if (arena()->tryGetSegment(_::SegmentId(1))) {
    // The message has more than one segment
    return false;
  }

  const word* readHead = segment->getStartPtr() + 1;
  return _::PointerReader::getRoot(segment, nullptr, segment->getStartPtr(), kj::maxValue)
                                  .isCanonical(&readHead);
}